

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestCoverageHandler.cxx
# Opt level: O0

int __thiscall
cmCTestCoverageHandler::RunBullseyeCoverageBranch
          (cmCTestCoverageHandler *this,cmCTestCoverageHandlerContainer *cont,
          set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *coveredFileNames,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *files,vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *filesFullPath)

{
  cmCTest *pcVar1;
  bool bVar2;
  byte bVar3;
  int iVar4;
  size_type sVar5;
  size_type sVar6;
  char *pcVar7;
  ostream *poVar8;
  reference pbVar9;
  reference __k;
  mapped_type *this_00;
  ulong uVar10;
  void *pvVar11;
  pointer value;
  int local_11e0;
  allocator<char> local_11d9;
  string local_11d8;
  int local_11b8;
  allocator<char> local_11b1;
  string local_11b0;
  int local_1190;
  allocator<char> local_1189;
  int k;
  string local_1168;
  allocator<char> local_1141;
  string local_1140;
  string local_1120 [32];
  undefined1 local_1100 [8];
  ostringstream cmCTestLog_msg_6;
  _Self local_f88;
  _Self local_f80;
  iterator i;
  undefined1 local_f58 [8];
  ostringstream cmCTestLog_msg_5;
  _Self local_de0;
  _Self local_dd8;
  string local_dd0 [39];
  byte local_da9;
  undefined1 local_da8 [7];
  bool startFile;
  string file;
  int line;
  bool valid;
  string lineIn;
  iterator iStack_d58;
  int count;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_d50;
  iterator f;
  iterator fp;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  fileMap;
  undefined1 local_cf0 [8];
  ostringstream cmCTestLog_msg_4;
  long local_b78;
  ifstream fin;
  string local_970 [32];
  undefined1 local_950 [8];
  ostringstream cmCTestLog_msg_3;
  string local_7d8 [32];
  undefined1 local_7b8 [8];
  ostringstream cmCTestLog_msg_2;
  string local_640 [32];
  undefined1 local_620 [8];
  ostringstream cmCTestLog_msg_1;
  undefined1 local_4a8 [8];
  string outputFile;
  undefined1 local_480 [4];
  int logFileCount;
  cmXMLWriter covLogXML;
  cmGeneratedFileStream covLogFile;
  ostringstream local_1b0 [8];
  ostringstream cmCTestLog_msg;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *filesFullPath_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *files_local;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *coveredFileNames_local;
  cmCTestCoverageHandlerContainer *cont_local;
  cmCTestCoverageHandler *this_local;
  
  sVar5 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size(files);
  sVar6 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size(filesFullPath);
  if (sVar5 == sVar6) {
    cmGeneratedFileStream::cmGeneratedFileStream
              ((cmGeneratedFileStream *)&covLogXML.ElementOpen,None);
    cmXMLWriter::cmXMLWriter((cmXMLWriter *)local_480,(ostream *)&covLogXML.ElementOpen,0);
    outputFile.field_2._12_4_ = 0;
    bVar2 = StartCoverageLogFile(this,(cmGeneratedFileStream *)&covLogXML.ElementOpen,0);
    if (bVar2) {
      StartCoverageLogXML(this,(cmXMLWriter *)local_480);
      std::__cxx11::string::string((string *)local_4a8);
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_620);
      poVar8 = std::operator<<((ostream *)local_620,"run covbr: ");
      std::ostream::operator<<(poVar8,std::endl<char,std::char_traits<char>>);
      pcVar1 = (this->super_cmCTestGenericHandler).CTest;
      std::__cxx11::ostringstream::str();
      pcVar7 = (char *)std::__cxx11::string::c_str();
      cmCTest::Log(pcVar1,5,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/CTest/cmCTestCoverageHandler.cxx"
                   ,0x71e,pcVar7,(bool)((this->super_cmCTestGenericHandler).Quiet & 1));
      std::__cxx11::string::~string(local_640);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_620);
      iVar4 = RunBullseyeCommand(this,cont,"covbr",(char *)0x0,(string *)local_4a8);
      if (iVar4 == 0) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_7b8);
        poVar8 = std::operator<<((ostream *)local_7b8,"error running covbr for.");
        std::operator<<(poVar8,"\n");
        pcVar1 = (this->super_cmCTestGenericHandler).CTest;
        std::__cxx11::ostringstream::str();
        pcVar7 = (char *)std::__cxx11::string::c_str();
        cmCTest::Log(pcVar1,7,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/CTest/cmCTestCoverageHandler.cxx"
                     ,0x723,pcVar7,false);
        std::__cxx11::string::~string(local_7d8);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_7b8);
        this_local._4_4_ = -1;
        outputFile.field_2._8_4_ = 1;
      }
      else {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_950);
        poVar8 = std::operator<<((ostream *)local_950,"covbr output in  ");
        poVar8 = std::operator<<(poVar8,(string *)local_4a8);
        std::ostream::operator<<(poVar8,std::endl<char,std::char_traits<char>>);
        pcVar1 = (this->super_cmCTestGenericHandler).CTest;
        std::__cxx11::ostringstream::str();
        pcVar7 = (char *)std::__cxx11::string::c_str();
        cmCTest::Log(pcVar1,5,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/CTest/cmCTestCoverageHandler.cxx"
                     ,0x728,pcVar7,(bool)((this->super_cmCTestGenericHandler).Quiet & 1));
        std::__cxx11::string::~string(local_970);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_950);
        pcVar7 = (char *)std::__cxx11::string::c_str();
        std::ifstream::ifstream(&local_b78,pcVar7,_S_in);
        bVar3 = std::ios::operator!((ios *)((long)&local_b78 + *(long *)(local_b78 + -0x18)));
        if ((bVar3 & 1) == 0) {
          std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 *)&fp);
          f = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::begin(filesFullPath);
          local_d50._M_current =
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::begin(files);
          while( true ) {
            iStack_d58 = std::
                         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ::end(files);
            bVar2 = __gnu_cxx::operator!=(&local_d50,&stack0xfffffffffffff2a8);
            if (!bVar2) break;
            pbVar9 = __gnu_cxx::
                     __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     ::operator*(&f);
            __k = __gnu_cxx::
                  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ::operator*(&local_d50);
            this_00 = std::
                      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                    *)&fp,__k);
            std::__cxx11::string::operator=((string *)this_00,(string *)pbVar9);
            __gnu_cxx::
            __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator++(&local_d50);
            __gnu_cxx::
            __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator++(&f);
          }
          lineIn.field_2._12_4_ = 0;
          std::__cxx11::string::string((string *)&line);
          file.field_2._M_local_buf[0xf] = '\0';
          file.field_2._8_4_ = 0;
          std::__cxx11::string::string((string *)local_da8);
          while (bVar2 = cmsys::SystemTools::GetLineFromStream
                                   ((istream *)&local_b78,(string *)&line,(bool *)0x0,-1), bVar2) {
            local_da9 = 0;
            uVar10 = std::__cxx11::string::size();
            if (1 < uVar10) {
              std::__cxx11::string::size();
              pcVar7 = (char *)std::__cxx11::string::operator[]((ulong)&line);
              if (*pcVar7 == ':') {
                std::__cxx11::string::size();
                std::__cxx11::string::substr((ulong)local_dd0,(ulong)&line);
                std::__cxx11::string::operator=((string *)local_da8,local_dd0);
                std::__cxx11::string::~string(local_dd0);
                local_dd8._M_node =
                     (_Base_ptr)
                     std::
                     set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ::find(coveredFileNames,(key_type *)local_da8);
                local_de0._M_node =
                     (_Base_ptr)
                     std::
                     set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ::end(coveredFileNames);
                bVar2 = std::operator!=(&local_dd8,&local_de0);
                if (bVar2) {
                  local_da9 = 1;
                }
              }
            }
            if ((local_da9 & 1) == 0) {
              if ((file.field_2._M_local_buf[0xf] & 1U) != 0) {
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_11d8,"Line",&local_11d9);
                cmXMLWriter::StartElement((cmXMLWriter *)local_480,&local_11d8);
                std::__cxx11::string::~string((string *)&local_11d8);
                std::allocator<char>::~allocator(&local_11d9);
                cmXMLWriter::Attribute<int>
                          ((cmXMLWriter *)local_480,"Number",(int *)(file.field_2._M_local_buf + 8))
                ;
                local_11e0 = -1;
                cmXMLWriter::Attribute<int>((cmXMLWriter *)local_480,"Count",&local_11e0);
                cmXMLWriter::Content<std::__cxx11::string>
                          ((cmXMLWriter *)local_480,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &line);
                cmXMLWriter::EndElement((cmXMLWriter *)local_480);
                file.field_2._8_4_ = file.field_2._8_4_ + 1;
              }
            }
            else {
              if ((file.field_2._M_local_buf[0xf] & 1U) != 0) {
                cmXMLWriter::EndElement((cmXMLWriter *)local_480);
                cmXMLWriter::EndElement((cmXMLWriter *)local_480);
              }
              if ((lineIn.field_2._12_4_ != 0) && ((int)lineIn.field_2._12_4_ % 100 == 0)) {
                std::__cxx11::ostringstream::ostringstream((ostringstream *)local_f58);
                poVar8 = std::operator<<((ostream *)local_f58,"start a new log file: ");
                pvVar11 = (void *)std::ostream::operator<<(poVar8,lineIn.field_2._12_4_);
                std::ostream::operator<<(pvVar11,std::endl<char,std::char_traits<char>>);
                pcVar1 = (this->super_cmCTestGenericHandler).CTest;
                std::__cxx11::ostringstream::str();
                pcVar7 = (char *)std::__cxx11::string::c_str();
                cmCTest::Log(pcVar1,5,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/CTest/cmCTestCoverageHandler.cxx"
                             ,0x74f,pcVar7,(bool)((this->super_cmCTestGenericHandler).Quiet & 1));
                std::__cxx11::string::~string((string *)&i);
                std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_f58);
                EndCoverageLogXML(this,(cmXMLWriter *)local_480);
                EndCoverageLogFile(this,(cmGeneratedFileStream *)&covLogXML.ElementOpen,
                                   outputFile.field_2._12_4_);
                outputFile.field_2._12_4_ = outputFile.field_2._12_4_ + 1;
                bVar2 = StartCoverageLogFile
                                  (this,(cmGeneratedFileStream *)&covLogXML.ElementOpen,
                                   outputFile.field_2._12_4_);
                if (!bVar2) {
                  this_local._4_4_ = -1;
                  goto LAB_0019b25b;
                }
                StartCoverageLogXML(this,(cmXMLWriter *)local_480);
                lineIn.field_2._12_4_ = lineIn.field_2._12_4_ + 1;
              }
              local_f80._M_node =
                   (_Base_ptr)
                   std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ::find((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           *)&fp,(key_type *)local_da8);
              local_f88._M_node =
                   (_Base_ptr)
                   std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)&fp);
              bVar2 = std::operator!=(&local_f80,&local_f88);
              if (bVar2) {
                lineIn.field_2._12_4_ = lineIn.field_2._12_4_ + 1;
                std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1100);
                poVar8 = std::operator<<((ostream *)local_1100,"Produce coverage for file: ");
                poVar8 = std::operator<<(poVar8,(string *)local_da8);
                poVar8 = std::operator<<(poVar8," ");
                pvVar11 = (void *)std::ostream::operator<<(poVar8,lineIn.field_2._12_4_);
                std::ostream::operator<<(pvVar11,std::endl<char,std::char_traits<char>>);
                pcVar1 = (this->super_cmCTestGenericHandler).CTest;
                std::__cxx11::ostringstream::str();
                pcVar7 = (char *)std::__cxx11::string::c_str();
                cmCTest::Log(pcVar1,5,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/CTest/cmCTestCoverageHandler.cxx"
                             ,0x761,pcVar7,(bool)((this->super_cmCTestGenericHandler).Quiet & 1));
                std::__cxx11::string::~string(local_1120);
                std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1100);
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_1140,"File",&local_1141);
                cmXMLWriter::StartElement((cmXMLWriter *)local_480,&local_1140);
                std::__cxx11::string::~string((string *)&local_1140);
                std::allocator<char>::~allocator(&local_1141);
                value = std::
                        _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ::operator->(&local_f80);
                cmXMLWriter::Attribute<std::__cxx11::string>
                          ((cmXMLWriter *)local_480,"Name",&value->first);
                pcVar1 = (this->super_cmCTestGenericHandler).CTest;
                std::
                _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::operator->(&local_f80);
                pcVar7 = (char *)std::__cxx11::string::c_str();
                cmCTest::GetShortPathToFile_abi_cxx11_(&local_1168,pcVar1,pcVar7);
                cmXMLWriter::Attribute<std::__cxx11::string>
                          ((cmXMLWriter *)local_480,"FullPath",&local_1168);
                std::__cxx11::string::~string((string *)&local_1168);
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&k,"Report",&local_1189);
                cmXMLWriter::StartElement((cmXMLWriter *)local_480,(string *)&k);
                std::__cxx11::string::~string((string *)&k);
                std::allocator<char>::~allocator(&local_1189);
                file.field_2._8_4_ = 0;
                local_1190 = 0;
                while (*(long *)((anonymous_namespace)::bullseyeHelp + (long)local_1190 * 8) != 0) {
                  std::allocator<char>::allocator();
                  std::__cxx11::string::string<std::allocator<char>>
                            ((string *)&local_11b0,"Line",&local_11b1);
                  cmXMLWriter::StartElement((cmXMLWriter *)local_480,&local_11b0);
                  std::__cxx11::string::~string((string *)&local_11b0);
                  std::allocator<char>::~allocator(&local_11b1);
                  cmXMLWriter::Attribute<int>
                            ((cmXMLWriter *)local_480,"Number",
                             (int *)(file.field_2._M_local_buf + 8));
                  local_11b8 = -1;
                  cmXMLWriter::Attribute<int>((cmXMLWriter *)local_480,"Count",&local_11b8);
                  cmXMLWriter::Content<char_const*>
                            ((cmXMLWriter *)local_480,
                             (char **)((anonymous_namespace)::bullseyeHelp + (long)local_1190 * 8));
                  cmXMLWriter::EndElement((cmXMLWriter *)local_480);
                  file.field_2._8_4_ = file.field_2._8_4_ + 1;
                  local_1190 = local_1190 + 1;
                }
                file.field_2._M_local_buf[0xf] = '\x01';
              }
              else {
                file.field_2._M_local_buf[0xf] = '\0';
              }
            }
          }
          if ((file.field_2._M_local_buf[0xf] & 1U) != 0) {
            cmXMLWriter::EndElement((cmXMLWriter *)local_480);
            cmXMLWriter::EndElement((cmXMLWriter *)local_480);
          }
          EndCoverageLogXML(this,(cmXMLWriter *)local_480);
          EndCoverageLogFile(this,(cmGeneratedFileStream *)&covLogXML.ElementOpen,
                             outputFile.field_2._12_4_);
          this_local._4_4_ = 1;
LAB_0019b25b:
          outputFile.field_2._8_4_ = 1;
          std::__cxx11::string::~string((string *)local_da8);
          std::__cxx11::string::~string((string *)&line);
          std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)&fp);
        }
        else {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_cf0);
          poVar8 = std::operator<<((ostream *)local_cf0,"Cannot open coverage file: ");
          poVar8 = std::operator<<(poVar8,(string *)local_4a8);
          std::ostream::operator<<(poVar8,std::endl<char,std::char_traits<char>>);
          pcVar1 = (this->super_cmCTestGenericHandler).CTest;
          std::__cxx11::ostringstream::str();
          pcVar7 = (char *)std::__cxx11::string::c_str();
          cmCTest::Log(pcVar1,7,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/CTest/cmCTestCoverageHandler.cxx"
                       ,0x72d,pcVar7,false);
          std::__cxx11::string::~string
                    ((string *)&fileMap._M_t._M_impl.super__Rb_tree_header._M_node_count);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_cf0);
          this_local._4_4_ = 0;
          outputFile.field_2._8_4_ = 1;
        }
        std::ifstream::~ifstream(&local_b78);
      }
      std::__cxx11::string::~string((string *)local_4a8);
    }
    else {
      this_local._4_4_ = -1;
      outputFile.field_2._8_4_ = 1;
    }
    cmXMLWriter::~cmXMLWriter((cmXMLWriter *)local_480);
    cmGeneratedFileStream::~cmGeneratedFileStream((cmGeneratedFileStream *)&covLogXML.ElementOpen);
  }
  else {
    std::__cxx11::ostringstream::ostringstream(local_1b0);
    std::operator<<((ostream *)local_1b0,"Files and full path files not the same size?:\n");
    pcVar1 = (this->super_cmCTestGenericHandler).CTest;
    std::__cxx11::ostringstream::str();
    pcVar7 = (char *)std::__cxx11::string::c_str();
    cmCTest::Log(pcVar1,7,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/CTest/cmCTestCoverageHandler.cxx"
                 ,0x70f,pcVar7,false);
    std::__cxx11::string::~string((string *)&covLogFile.field_0x240);
    std::__cxx11::ostringstream::~ostringstream(local_1b0);
    this_local._4_4_ = 0;
  }
  return this_local._4_4_;
}

Assistant:

int cmCTestCoverageHandler::RunBullseyeCoverageBranch(
  cmCTestCoverageHandlerContainer* cont,
  std::set<std::string>& coveredFileNames, std::vector<std::string>& files,
  std::vector<std::string>& filesFullPath)
{
  if (files.size() != filesFullPath.size()) {
    cmCTestLog(this->CTest, ERROR_MESSAGE,
               "Files and full path files not the same size?:\n");
    return 0;
  }
  // create the output stream for the CoverageLog-N.xml file
  cmGeneratedFileStream covLogFile;
  cmXMLWriter covLogXML(covLogFile);
  int logFileCount = 0;
  if (!this->StartCoverageLogFile(covLogFile, logFileCount)) {
    return -1;
  }
  this->StartCoverageLogXML(covLogXML);
  // for each file run covbr on that file to get the coverage
  // information for that file
  std::string outputFile;
  cmCTestOptionalLog(this->CTest, HANDLER_VERBOSE_OUTPUT,
                     "run covbr: " << std::endl, this->Quiet);

  if (!this->RunBullseyeCommand(cont, "covbr", nullptr, outputFile)) {
    cmCTestLog(this->CTest, ERROR_MESSAGE,
               "error running covbr for."
                 << "\n");
    return -1;
  }
  cmCTestOptionalLog(this->CTest, HANDLER_VERBOSE_OUTPUT,
                     "covbr output in  " << outputFile << std::endl,
                     this->Quiet);
  // open the output file
  cmsys::ifstream fin(outputFile.c_str());
  if (!fin) {
    cmCTestLog(this->CTest, ERROR_MESSAGE,
               "Cannot open coverage file: " << outputFile << std::endl);
    return 0;
  }
  std::map<std::string, std::string> fileMap;
  std::vector<std::string>::iterator fp = filesFullPath.begin();
  for (std::vector<std::string>::iterator f = files.begin(); f != files.end();
       ++f, ++fp) {
    fileMap[*f] = *fp;
  }

  int count = 0; // keep count of the number of files
  // Now parse each line from the bullseye cov log file
  std::string lineIn;
  bool valid = false; // are we in a valid output file
  int line = 0;       // line of the current file
  std::string file;
  while (cmSystemTools::GetLineFromStream(fin, lineIn)) {
    bool startFile = false;
    if (lineIn.size() > 1 && lineIn[lineIn.size() - 1] == ':') {
      file = lineIn.substr(0, lineIn.size() - 1);
      if (coveredFileNames.find(file) != coveredFileNames.end()) {
        startFile = true;
      }
    }
    if (startFile) {
      // if we are in a valid file close it because a new one started
      if (valid) {
        covLogXML.EndElement(); // Report
        covLogXML.EndElement(); // File
      }
      // only allow 100 files in each log file
      if (count != 0 && count % 100 == 0) {
        cmCTestOptionalLog(this->CTest, HANDLER_VERBOSE_OUTPUT,
                           "start a new log file: " << count << std::endl,
                           this->Quiet);
        this->EndCoverageLogXML(covLogXML);
        this->EndCoverageLogFile(covLogFile, logFileCount);
        logFileCount++;
        if (!this->StartCoverageLogFile(covLogFile, logFileCount)) {
          return -1;
        }
        this->StartCoverageLogXML(covLogXML);
        count++; // move on one
      }
      std::map<std::string, std::string>::iterator i = fileMap.find(file);
      // if the file should be covered write out the header for that file
      if (i != fileMap.end()) {
        // we have a new file so count it in the output
        count++;
        cmCTestOptionalLog(this->CTest, HANDLER_VERBOSE_OUTPUT,
                           "Produce coverage for file: " << file << " "
                                                         << count << std::endl,
                           this->Quiet);
        // start the file output
        covLogXML.StartElement("File");
        covLogXML.Attribute("Name", i->first);
        covLogXML.Attribute(
          "FullPath", this->CTest->GetShortPathToFile(i->second.c_str()));
        covLogXML.StartElement("Report");
        // write the bullseye header
        line = 0;
        for (int k = 0; bullseyeHelp[k] != nullptr; ++k) {
          covLogXML.StartElement("Line");
          covLogXML.Attribute("Number", line);
          covLogXML.Attribute("Count", -1);
          covLogXML.Content(bullseyeHelp[k]);
          covLogXML.EndElement(); // Line
          line++;
        }
        valid = true; // we are in a valid file section
      } else {
        // this is not a file that we want coverage for
        valid = false;
      }
    }
    // we are not at a start file, and we are in a valid file output the line
    else if (valid) {
      covLogXML.StartElement("Line");
      covLogXML.Attribute("Number", line);
      covLogXML.Attribute("Count", -1);
      covLogXML.Content(lineIn);
      covLogXML.EndElement(); // Line
      line++;
    }
  }
  // if we ran out of lines a valid file then close that file
  if (valid) {
    covLogXML.EndElement(); // Report
    covLogXML.EndElement(); // File
  }
  this->EndCoverageLogXML(covLogXML);
  this->EndCoverageLogFile(covLogFile, logFileCount);
  return 1;
}